

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  ImDrawIdx IVar2;
  int iVar3;
  uint uVar4;
  ImVec2 *pIVar5;
  ImDrawListSharedData *pIVar6;
  short sVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ImDrawIdx IVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  ulong uVar14;
  ImDrawIdx IVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  if (2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      pIVar12 = this->_VtxWritePtr;
      uVar9 = 0;
      do {
        pIVar12->pos = points[uVar9];
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        pIVar12 = this->_VtxWritePtr + 1;
        this->_VtxWritePtr = pIVar12;
        uVar9 = uVar9 + 1;
      } while ((uint)points_count != uVar9);
      pIVar13 = this->_IdxWritePtr;
      iVar3 = 2;
      sVar7 = 1;
      do {
        *pIVar13 = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = sVar7 + (short)this->_VtxCurrentIdx;
        this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + (short)iVar3;
        pIVar13 = this->_IdxWritePtr + 3;
        this->_IdxWritePtr = pIVar13;
        iVar3 = iVar3 + 1;
        sVar7 = sVar7 + 1;
      } while (points_count != iVar3);
      uVar4 = points_count & 0xffff;
    }
    else {
      fVar21 = this->_FringeScale;
      PrimReserve(this,points_count * 9 + -6,points_count * 2);
      uVar4 = this->_VtxCurrentIdx;
      IVar2 = (ImDrawIdx)uVar4;
      pIVar13 = this->_IdxWritePtr;
      iVar3 = uVar4 + 2;
      iVar8 = 2;
      do {
        *pIVar13 = IVar2;
        this->_IdxWritePtr[1] = (ImDrawIdx)iVar3;
        iVar3 = iVar3 + 2;
        this->_IdxWritePtr[2] = (ImDrawIdx)iVar3;
        pIVar13 = this->_IdxWritePtr + 3;
        this->_IdxWritePtr = pIVar13;
        iVar8 = iVar8 + 1;
      } while (points_count != iVar8);
      pIVar6 = this->_Data;
      uVar9 = (ulong)(uint)points_count;
      if ((pIVar6->TempBuffer).Capacity < points_count) {
        pIVar5 = (pIVar6->TempBuffer).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar5);
        }
        pIVar5 = (ImVec2 *)ImGui::MemAlloc(uVar9 * 8);
        (pIVar6->TempBuffer).Data = pIVar5;
        (pIVar6->TempBuffer).Capacity = points_count;
        pIVar6 = this->_Data;
      }
      pIVar5 = (pIVar6->TempBuffer).Data;
      uVar16 = (ulong)(points_count - 1);
      uVar10 = 0;
      uVar14 = uVar16;
      do {
        iVar3 = (int)uVar14;
        fVar17 = points[uVar10].x - points[iVar3].x;
        fVar18 = points[uVar10].y - points[iVar3].y;
        fVar19 = fVar17 * fVar17 + fVar18 * fVar18;
        if (0.0 < fVar19) {
          fVar19 = 1.0 / SQRT(fVar19);
          fVar17 = fVar17 * fVar19;
          fVar18 = fVar18 * fVar19;
        }
        pIVar5[iVar3].x = fVar18;
        pIVar5[iVar3].y = -fVar17;
        uVar14 = uVar10 & 0xffffffff;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      fVar21 = fVar21 * 0.5;
      uVar10 = 0;
      do {
        fVar17 = (pIVar5[uVar10].x + pIVar5[(int)uVar16].x) * 0.5;
        fVar18 = (pIVar5[uVar10].y + pIVar5[(int)uVar16].y) * 0.5;
        fVar19 = fVar17 * fVar17 + fVar18 * fVar18;
        if (1e-06 < fVar19) {
          fVar19 = 1.0 / fVar19;
          fVar20 = 100.0;
          if (fVar19 <= 100.0) {
            fVar20 = fVar19;
          }
          fVar17 = fVar17 * fVar20;
          fVar18 = fVar18 * fVar20;
        }
        fVar17 = fVar21 * fVar17;
        fVar18 = fVar18 * fVar21;
        (this->_VtxWritePtr->pos).x = points[uVar10].x - fVar17;
        (this->_VtxWritePtr->pos).y = points[uVar10].y - fVar18;
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = fVar17 + points[uVar10].x;
        this->_VtxWritePtr[1].pos.y = fVar18 + points[uVar10].y;
        this->_VtxWritePtr[1].uv = IVar1;
        this->_VtxWritePtr[1].col = col & 0xffffff;
        this->_VtxWritePtr = this->_VtxWritePtr + 2;
        IVar11 = (ImDrawIdx)uVar4;
        *this->_IdxWritePtr = IVar11;
        this->_IdxWritePtr[1] = IVar2 + (short)uVar16 * 2;
        IVar15 = IVar2 + 1 + (short)uVar16 * 2;
        this->_IdxWritePtr[2] = IVar15;
        this->_IdxWritePtr[3] = IVar15;
        this->_IdxWritePtr[4] = IVar11 + 1;
        this->_IdxWritePtr[5] = IVar11;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        uVar16 = uVar10 & 0xffffffff;
        uVar10 = uVar10 + 1;
        uVar4 = uVar4 + 2;
      } while (uVar9 != uVar10);
      uVar4 = points_count * 2 & 0xfffe;
    }
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + uVar4;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}